

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rep.c
# Opt level: O1

int rep0_pipe_start(void *arg)

{
  nni_mtx *mtx;
  uint16_t uVar1;
  uint32_t uVar2;
  int iVar3;
  
  mtx = *(nni_mtx **)((long)arg + 8);
  uVar1 = nni_pipe_peer(*arg);
  if (uVar1 == 0x30) {
    nni_mtx_lock(mtx);
    uVar2 = nni_pipe_id(*arg);
    iVar3 = nni_id_set((nni_id_map *)((long)&mtx[1].mtx + 8),(ulong)uVar2,arg);
    nni_mtx_unlock(mtx);
    if (iVar3 == 0) {
      nni_pipe_recv(*arg,(nni_aio *)((long)arg + 0x1e0));
      iVar3 = 0;
    }
  }
  else {
    uVar1 = nni_pipe_peer(*arg);
    nng_log_warn("NNG-PEER-MISMATCH","Peer protocol mismatch: %d != %d, rejected.",(ulong)uVar1,0x30
                );
    iVar3 = 0xd;
  }
  return iVar3;
}

Assistant:

static int
rep0_pipe_start(void *arg)
{
	rep0_pipe *p = arg;
	rep0_sock *s = p->rep;
	int        rv;

	if (nni_pipe_peer(p->pipe) != REP0_PEER) {
		// Peer protocol mismatch.
		nng_log_warn("NNG-PEER-MISMATCH",
		    "Peer protocol mismatch: %d != %d, rejected.",
		    nni_pipe_peer(p->pipe), REP0_PEER);
		return (NNG_EPROTO);
	}

	nni_mtx_lock(&s->lk);
	rv = nni_id_set(&s->pipes, nni_pipe_id(p->pipe), p);
	nni_mtx_unlock(&s->lk);
	if (rv != 0) {
		return (rv);
	}
	// By definition, we have not received a request yet on this pipe,
	// so it cannot cause us to become writable.
	nni_pipe_recv(p->pipe, &p->aio_recv);
	return (0);
}